

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O0

void google::protobuf::TestUtilLite::SetAllFields(TestAllTypesLite *message)

{
  OneofFieldCase OVar1;
  uint32_t *puVar2;
  Arena *pAVar3;
  TestAllTypesLite_OptionalGroup *this;
  TestAllTypesLite_NestedMessage *pTVar4;
  ForeignMessageLite *pFVar5;
  ImportMessageLite *pIVar6;
  PublicImportMessageLite *this_00;
  TestAllTypesLite_RepeatedGroup *pTVar7;
  TestAllTypesLite *message_local;
  
  proto2_unittest::TestAllTypesLite::set_optional_int32(message,0x65);
  proto2_unittest::TestAllTypesLite::set_optional_int64(message,0x66);
  proto2_unittest::TestAllTypesLite::set_optional_uint32(message,0x67);
  proto2_unittest::TestAllTypesLite::set_optional_uint64(message,0x68);
  proto2_unittest::TestAllTypesLite::set_optional_sint32(message,0x69);
  proto2_unittest::TestAllTypesLite::set_optional_sint64(message,0x6a);
  proto2_unittest::TestAllTypesLite::set_optional_fixed32(message,0x6b);
  proto2_unittest::TestAllTypesLite::set_optional_fixed64(message,0x6c);
  proto2_unittest::TestAllTypesLite::set_optional_sfixed32(message,0x6d);
  proto2_unittest::TestAllTypesLite::set_optional_sfixed64(message,0x6e);
  proto2_unittest::TestAllTypesLite::set_optional_float(message,111.0);
  proto2_unittest::TestAllTypesLite::set_optional_double(message,112.0);
  proto2_unittest::TestAllTypesLite::set_optional_bool(message,true);
  puVar2 = internal::HasBits<2>::operator[](&(message->field_0)._impl_._has_bits_,0);
  *puVar2 = *puVar2 | 1;
  pAVar3 = MessageLite::GetArena(&message->super_MessageLite);
  internal::ArenaStringPtr::Set(&(message->field_0)._impl_.optional_string_,"115",pAVar3);
  puVar2 = internal::HasBits<2>::operator[](&(message->field_0)._impl_._has_bits_,0);
  *puVar2 = *puVar2 | 2;
  pAVar3 = MessageLite::GetArena(&message->super_MessageLite);
  internal::ArenaStringPtr::SetBytes(&(message->field_0)._impl_.optional_bytes_,"116",pAVar3);
  this = proto2_unittest::TestAllTypesLite::mutable_optionalgroup(message);
  proto2_unittest::TestAllTypesLite_OptionalGroup::set_a(this,0x75);
  pTVar4 = proto2_unittest::TestAllTypesLite::mutable_optional_nested_message(message);
  proto2_unittest::TestAllTypesLite_NestedMessage::set_bb(pTVar4,0x76);
  pFVar5 = proto2_unittest::TestAllTypesLite::mutable_optional_foreign_message(message);
  proto2_unittest::ForeignMessageLite::set_c(pFVar5,0x77);
  pIVar6 = proto2_unittest::TestAllTypesLite::mutable_optional_import_message(message);
  proto2_unittest_import::ImportMessageLite::set_d(pIVar6,0x78);
  this_00 = proto2_unittest::TestAllTypesLite::mutable_optional_public_import_message(message);
  proto2_unittest_import::PublicImportMessageLite::set_e(this_00,0x7e);
  pTVar4 = proto2_unittest::TestAllTypesLite::mutable_optional_lazy_message(message);
  proto2_unittest::TestAllTypesLite_NestedMessage::set_bb(pTVar4,0x7f);
  pTVar4 = proto2_unittest::TestAllTypesLite::mutable_optional_unverified_lazy_message(message);
  proto2_unittest::TestAllTypesLite_NestedMessage::set_bb(pTVar4,0x80);
  proto2_unittest::TestAllTypesLite::set_optional_nested_enum
            (message,TestAllTypesLite_NestedEnum_BAZ);
  proto2_unittest::TestAllTypesLite::set_optional_foreign_enum(message,FOREIGN_LITE_BAZ);
  proto2_unittest::TestAllTypesLite::set_optional_import_enum(message,IMPORT_LITE_BAZ);
  proto2_unittest::TestAllTypesLite::add_repeated_int32(message,0xc9);
  proto2_unittest::TestAllTypesLite::add_repeated_int64(message,0xca);
  proto2_unittest::TestAllTypesLite::add_repeated_uint32(message,0xcb);
  proto2_unittest::TestAllTypesLite::add_repeated_uint64(message,0xcc);
  proto2_unittest::TestAllTypesLite::add_repeated_sint32(message,0xcd);
  proto2_unittest::TestAllTypesLite::add_repeated_sint64(message,0xce);
  proto2_unittest::TestAllTypesLite::add_repeated_fixed32(message,0xcf);
  proto2_unittest::TestAllTypesLite::add_repeated_fixed64(message,0xd0);
  proto2_unittest::TestAllTypesLite::add_repeated_sfixed32(message,0xd1);
  proto2_unittest::TestAllTypesLite::add_repeated_sfixed64(message,0xd2);
  proto2_unittest::TestAllTypesLite::add_repeated_float(message,211.0);
  proto2_unittest::TestAllTypesLite::add_repeated_double(message,212.0);
  proto2_unittest::TestAllTypesLite::add_repeated_bool(message,true);
  proto2_unittest::TestAllTypesLite::add_repeated_string<char_const(&)[4]>
            (message,(char (*) [4])"215");
  proto2_unittest::TestAllTypesLite::add_repeated_bytes<char_const(&)[4]>
            (message,(char (*) [4])"216");
  pTVar7 = proto2_unittest::TestAllTypesLite::add_repeatedgroup(message);
  proto2_unittest::TestAllTypesLite_RepeatedGroup::set_a(pTVar7,0xd9);
  pTVar4 = proto2_unittest::TestAllTypesLite::add_repeated_nested_message(message);
  proto2_unittest::TestAllTypesLite_NestedMessage::set_bb(pTVar4,0xda);
  pFVar5 = proto2_unittest::TestAllTypesLite::add_repeated_foreign_message(message);
  proto2_unittest::ForeignMessageLite::set_c(pFVar5,0xdb);
  pIVar6 = proto2_unittest::TestAllTypesLite::add_repeated_import_message(message);
  proto2_unittest_import::ImportMessageLite::set_d(pIVar6,0xdc);
  pTVar4 = proto2_unittest::TestAllTypesLite::add_repeated_lazy_message(message);
  proto2_unittest::TestAllTypesLite_NestedMessage::set_bb(pTVar4,0xe3);
  proto2_unittest::TestAllTypesLite::add_repeated_nested_enum
            (message,TestAllTypesLite_NestedEnum_BAR);
  proto2_unittest::TestAllTypesLite::add_repeated_foreign_enum(message,FOREIGN_LITE_BAR);
  proto2_unittest::TestAllTypesLite::add_repeated_import_enum(message,IMPORT_LITE_BAR);
  proto2_unittest::TestAllTypesLite::add_repeated_int32(message,0x12d);
  proto2_unittest::TestAllTypesLite::add_repeated_int64(message,0x12e);
  proto2_unittest::TestAllTypesLite::add_repeated_uint32(message,0x12f);
  proto2_unittest::TestAllTypesLite::add_repeated_uint64(message,0x130);
  proto2_unittest::TestAllTypesLite::add_repeated_sint32(message,0x131);
  proto2_unittest::TestAllTypesLite::add_repeated_sint64(message,0x132);
  proto2_unittest::TestAllTypesLite::add_repeated_fixed32(message,0x133);
  proto2_unittest::TestAllTypesLite::add_repeated_fixed64(message,0x134);
  proto2_unittest::TestAllTypesLite::add_repeated_sfixed32(message,0x135);
  proto2_unittest::TestAllTypesLite::add_repeated_sfixed64(message,0x136);
  proto2_unittest::TestAllTypesLite::add_repeated_float(message,311.0);
  proto2_unittest::TestAllTypesLite::add_repeated_double(message,312.0);
  proto2_unittest::TestAllTypesLite::add_repeated_bool(message,false);
  proto2_unittest::TestAllTypesLite::add_repeated_string<char_const(&)[4]>
            (message,(char (*) [4])"315");
  proto2_unittest::TestAllTypesLite::add_repeated_bytes<char_const(&)[4]>
            (message,(char (*) [4])"316");
  pTVar7 = proto2_unittest::TestAllTypesLite::add_repeatedgroup(message);
  proto2_unittest::TestAllTypesLite_RepeatedGroup::set_a(pTVar7,0x13d);
  pTVar4 = proto2_unittest::TestAllTypesLite::add_repeated_nested_message(message);
  proto2_unittest::TestAllTypesLite_NestedMessage::set_bb(pTVar4,0x13e);
  pFVar5 = proto2_unittest::TestAllTypesLite::add_repeated_foreign_message(message);
  proto2_unittest::ForeignMessageLite::set_c(pFVar5,0x13f);
  pIVar6 = proto2_unittest::TestAllTypesLite::add_repeated_import_message(message);
  proto2_unittest_import::ImportMessageLite::set_d(pIVar6,0x140);
  pTVar4 = proto2_unittest::TestAllTypesLite::add_repeated_lazy_message(message);
  proto2_unittest::TestAllTypesLite_NestedMessage::set_bb(pTVar4,0x147);
  proto2_unittest::TestAllTypesLite::add_repeated_nested_enum
            (message,TestAllTypesLite_NestedEnum_BAZ);
  proto2_unittest::TestAllTypesLite::add_repeated_foreign_enum(message,FOREIGN_LITE_BAZ);
  proto2_unittest::TestAllTypesLite::add_repeated_import_enum(message,IMPORT_LITE_BAZ);
  proto2_unittest::TestAllTypesLite::set_default_int32(message,0x191);
  proto2_unittest::TestAllTypesLite::set_default_int64(message,0x192);
  proto2_unittest::TestAllTypesLite::set_default_uint32(message,0x193);
  proto2_unittest::TestAllTypesLite::set_default_uint64(message,0x194);
  proto2_unittest::TestAllTypesLite::set_default_sint32(message,0x195);
  proto2_unittest::TestAllTypesLite::set_default_sint64(message,0x196);
  proto2_unittest::TestAllTypesLite::set_default_fixed32(message,0x197);
  proto2_unittest::TestAllTypesLite::set_default_fixed64(message,0x198);
  proto2_unittest::TestAllTypesLite::set_default_sfixed32(message,0x199);
  proto2_unittest::TestAllTypesLite::set_default_sfixed64(message,0x19a);
  proto2_unittest::TestAllTypesLite::set_default_float(message,411.0);
  proto2_unittest::TestAllTypesLite::set_default_double(message,412.0);
  proto2_unittest::TestAllTypesLite::set_default_bool(message,false);
  puVar2 = internal::HasBits<2>::operator[](&(message->field_0)._impl_._has_bits_,0);
  *puVar2 = *puVar2 | 0x8000000;
  pAVar3 = MessageLite::GetArena(&message->super_MessageLite);
  internal::ArenaStringPtr::Set(&(message->field_0)._impl_.default_string_,"415",pAVar3);
  puVar2 = internal::HasBits<2>::operator[](&(message->field_0)._impl_._has_bits_,0);
  *puVar2 = *puVar2 | 0x10000000;
  pAVar3 = MessageLite::GetArena(&message->super_MessageLite);
  internal::ArenaStringPtr::SetBytes(&(message->field_0)._impl_.default_bytes_,"416",pAVar3);
  proto2_unittest::TestAllTypesLite::set_default_nested_enum
            (message,TestAllTypesLite_NestedEnum_FOO);
  proto2_unittest::TestAllTypesLite::set_default_foreign_enum(message,FOREIGN_LITE_FOO);
  proto2_unittest::TestAllTypesLite::set_default_import_enum(message,IMPORT_LITE_FOO);
  proto2_unittest::TestAllTypesLite::set_oneof_uint32(message,0x259);
  pTVar4 = proto2_unittest::TestAllTypesLite::mutable_oneof_nested_message(message);
  proto2_unittest::TestAllTypesLite_NestedMessage::set_bb(pTVar4,0x25a);
  OVar1 = proto2_unittest::TestAllTypesLite::oneof_field_case(message);
  if (OVar1 != kOneofString) {
    proto2_unittest::TestAllTypesLite::clear_oneof_field(message);
    proto2_unittest::TestAllTypesLite::set_has_oneof_string(message);
    internal::ArenaStringPtr::InitDefault(&(message->field_0)._impl_.oneof_field_.oneof_string_);
  }
  pAVar3 = MessageLite::GetArena(&message->super_MessageLite);
  internal::ArenaStringPtr::Set(&(message->field_0)._impl_.oneof_field_.oneof_string_,"603",pAVar3);
  OVar1 = proto2_unittest::TestAllTypesLite::oneof_field_case(message);
  if (OVar1 != kOneofBytes) {
    proto2_unittest::TestAllTypesLite::clear_oneof_field(message);
    proto2_unittest::TestAllTypesLite::set_has_oneof_bytes(message);
    internal::ArenaStringPtr::InitDefault(&(message->field_0)._impl_.oneof_field_.oneof_string_);
  }
  pAVar3 = MessageLite::GetArena(&message->super_MessageLite);
  internal::ArenaStringPtr::SetBytes
            (&(message->field_0)._impl_.oneof_field_.oneof_string_,"604",pAVar3);
  return;
}

Assistant:

void TestUtilLite::SetAllFields(unittest::TestAllTypesLite* message) {
  message->set_optional_int32(101);
  message->set_optional_int64(102);
  message->set_optional_uint32(103);
  message->set_optional_uint64(104);
  message->set_optional_sint32(105);
  message->set_optional_sint64(106);
  message->set_optional_fixed32(107);
  message->set_optional_fixed64(108);
  message->set_optional_sfixed32(109);
  message->set_optional_sfixed64(110);
  message->set_optional_float(111);
  message->set_optional_double(112);
  message->set_optional_bool(true);
  message->set_optional_string("115");
  message->set_optional_bytes("116");

  message->mutable_optionalgroup()->set_a(117);
  message->mutable_optional_nested_message()->set_bb(118);
  message->mutable_optional_foreign_message()->set_c(119);
  message->mutable_optional_import_message()->set_d(120);
  message->mutable_optional_public_import_message()->set_e(126);
  message->mutable_optional_lazy_message()->set_bb(127);
  message->mutable_optional_unverified_lazy_message()->set_bb(128);

  message->set_optional_nested_enum(unittest::TestAllTypesLite::BAZ);
  message->set_optional_foreign_enum(unittest::FOREIGN_LITE_BAZ);
  message->set_optional_import_enum(unittest_import::IMPORT_LITE_BAZ);


  // -----------------------------------------------------------------

  message->add_repeated_int32(201);
  message->add_repeated_int64(202);
  message->add_repeated_uint32(203);
  message->add_repeated_uint64(204);
  message->add_repeated_sint32(205);
  message->add_repeated_sint64(206);
  message->add_repeated_fixed32(207);
  message->add_repeated_fixed64(208);
  message->add_repeated_sfixed32(209);
  message->add_repeated_sfixed64(210);
  message->add_repeated_float(211);
  message->add_repeated_double(212);
  message->add_repeated_bool(true);
  message->add_repeated_string("215");
  message->add_repeated_bytes("216");

  message->add_repeatedgroup()->set_a(217);
  message->add_repeated_nested_message()->set_bb(218);
  message->add_repeated_foreign_message()->set_c(219);
  message->add_repeated_import_message()->set_d(220);
  message->add_repeated_lazy_message()->set_bb(227);

  message->add_repeated_nested_enum(unittest::TestAllTypesLite::BAR);
  message->add_repeated_foreign_enum(unittest::FOREIGN_LITE_BAR);
  message->add_repeated_import_enum(unittest_import::IMPORT_LITE_BAR);


  // Add a second one of each field.
  message->add_repeated_int32(301);
  message->add_repeated_int64(302);
  message->add_repeated_uint32(303);
  message->add_repeated_uint64(304);
  message->add_repeated_sint32(305);
  message->add_repeated_sint64(306);
  message->add_repeated_fixed32(307);
  message->add_repeated_fixed64(308);
  message->add_repeated_sfixed32(309);
  message->add_repeated_sfixed64(310);
  message->add_repeated_float(311);
  message->add_repeated_double(312);
  message->add_repeated_bool(false);
  message->add_repeated_string("315");
  message->add_repeated_bytes("316");

  message->add_repeatedgroup()->set_a(317);
  message->add_repeated_nested_message()->set_bb(318);
  message->add_repeated_foreign_message()->set_c(319);
  message->add_repeated_import_message()->set_d(320);
  message->add_repeated_lazy_message()->set_bb(327);

  message->add_repeated_nested_enum(unittest::TestAllTypesLite::BAZ);
  message->add_repeated_foreign_enum(unittest::FOREIGN_LITE_BAZ);
  message->add_repeated_import_enum(unittest_import::IMPORT_LITE_BAZ);


  // -----------------------------------------------------------------

  message->set_default_int32(401);
  message->set_default_int64(402);
  message->set_default_uint32(403);
  message->set_default_uint64(404);
  message->set_default_sint32(405);
  message->set_default_sint64(406);
  message->set_default_fixed32(407);
  message->set_default_fixed64(408);
  message->set_default_sfixed32(409);
  message->set_default_sfixed64(410);
  message->set_default_float(411);
  message->set_default_double(412);
  message->set_default_bool(false);
  message->set_default_string("415");
  message->set_default_bytes("416");

  message->set_default_nested_enum(unittest::TestAllTypesLite::FOO);
  message->set_default_foreign_enum(unittest::FOREIGN_LITE_FOO);
  message->set_default_import_enum(unittest_import::IMPORT_LITE_FOO);


  message->set_oneof_uint32(601);
  message->mutable_oneof_nested_message()->set_bb(602);
  message->set_oneof_string("603");
  message->set_oneof_bytes("604");
}